

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::ClassId(TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_70;
  TPZGeoPyramid local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_70);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[2]._0_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[2]._4_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[3]._0_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[3]._4_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[0]._0_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[0]._4_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[1]._0_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[1]._4_4_ = 0xffffffff;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[4] = -1;
  local_50.super_TPZNodeRep<5,_pztopology::TPZPyramid>.super_TPZPyramid.super_TPZSavable.
  _vptr_TPZSavable = (TPZSavable)&PTR__TPZGeoPyramid_0188d7d0;
  iVar3 = pzgeom::TPZGeoPyramid::ClassId(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}